

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipoleAtomTypesSectionParser.cpp
# Opt level: O0

void __thiscall
OpenMD::MultipoleAtomTypesSectionParser::parseDipole
          (MultipoleAtomTypesSectionParser *this,StringTokenizer *tokenizer,RealType *dipoleMoment,
          int lineNo)

{
  bool bVar1;
  uint in_ECX;
  StringTokenizer *in_RDX;
  RealType RVar2;
  
  bVar1 = StringTokenizer::hasMoreTokens(in_RDX);
  if (bVar1) {
    RVar2 = StringTokenizer::nextTokenAsDouble((StringTokenizer *)this);
    *(RealType *)&in_RDX->tokenString_ = RVar2;
  }
  else {
    snprintf(painCave.errMsg,2000,
             "MultipoleAtomTypesSectionParser Error: Not enough tokens at line %d\n",(ulong)in_ECX);
    painCave.isFatal = 1;
    simError();
  }
  return;
}

Assistant:

void MultipoleAtomTypesSectionParser::parseDipole(StringTokenizer& tokenizer,
                                                    RealType& dipoleMoment,
                                                    int lineNo) {
    if (tokenizer.hasMoreTokens()) {
      dipoleMoment = tokenizer.nextTokenAsDouble();
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "MultipoleAtomTypesSectionParser Error: Not enough tokens at "
               "line %d\n",
               lineNo);
      painCave.isFatal = 1;
      simError();
    }
  }